

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

TPZSkylMatrix<double> * __thiscall
TPZSkylMatrix<double>::operator-
          (TPZSkylMatrix<double> *__return_storage_ptr__,TPZSkylMatrix<double> *this,
          TPZSkylMatrix<double> *A)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  
  iVar4 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])(this);
  iVar5 = (*(A->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xc])
                    (A);
  if (CONCAT44(extraout_var,iVar4) != CONCAT44(extraout_var_00,iVar5)) {
    TPZMatrix<double>::Error
              ("TPZSkylMatrix<TVar> TPZSkylMatrix<double>::operator-(const TPZSkylMatrix<TVar> &) const [TVar = double]"
               ,"<incompatible dimensions>");
  }
  (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x4a])
            (this,this,A);
  TPZSkylMatrix(__return_storage_ptr__,this);
  lVar1 = (__return_storage_ptr__->fStorage).fNElements;
  if (0 < lVar1) {
    pdVar2 = (A->fStorage).fStore;
    pdVar3 = (__return_storage_ptr__->fStorage).fStore;
    lVar6 = 0;
    do {
      pdVar3[lVar6] = pdVar3[lVar6] - pdVar2[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar1 != lVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

TPZSkylMatrix<TVar>
TPZSkylMatrix<TVar>::operator-(const TPZSkylMatrix<TVar> &A ) const
{
  if ( this->Dim() != A.Dim() )
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"<incompatible dimensions>" );
  CheckTypeCompatibility(this,&A);
	auto res(*this);
  const auto size = res.fStorage.size();
  for(auto i = 0; i < size; i++) res.fStorage[i] -= A.fStorage[i];
	return res;
}